

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O2

int main(void)

{
  _Rb_tree_header *p_Var1;
  uint value;
  cake_iterator<false> first;
  undefined1 auVar2 [24];
  undefined1 auVar3 [24];
  undefined1 auVar4 [24];
  ostream *poVar5;
  _Base_ptr p_Var6;
  int i;
  uint uVar7;
  int i_1;
  int iVar8;
  bool bVar9;
  initializer_list<int> __l;
  initializer_list<double> l;
  ulong in_stack_ffffffffffffe100;
  undefined8 uVar10;
  undefined1 uVar11;
  undefined7 in_stack_ffffffffffffe111;
  vector<int,_std::allocator<int>_> v;
  multiset<int,_std::less<int>,_std::allocator<int>_> iset;
  iterator local_1e98;
  iterator local_1e80;
  double local_1e68 [3];
  skiplist<int,_std::less<int>_> iskip;
  skiplist<int,_std::less<int>_> skiplistFromVector;
  skiplist<double,_std::less<double>_> slFromInitializer;
  
  p_Var1 = &iset._M_t._M_impl.super__Rb_tree_header;
  iset._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  iset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  iset._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar7 = 0;
  iVar8 = 10;
  iset._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  iset._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  while (bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
    iskip.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = uVar7 - 5;
    if (uVar7 < 5) {
      iskip.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = uVar7;
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
    _M_insert_equal<int>(&iset._M_t,(int *)&iskip);
    uVar7 = uVar7 + 1;
  }
  iskip.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
            (&iset._M_t,(key_type *)&iskip);
  iskip.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
            (&iset._M_t,(key_type *)&iskip);
  iskip.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
            (&iset._M_t,(key_type *)&iskip);
  iskip.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 2;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
            (&iset._M_t,(key_type *)&iskip);
  iskip.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 7;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
            (&iset._M_t,(key_type *)&iskip);
  std::operator<<((ostream *)&std::cout,"The mulitset has:\n");
  for (p_Var6 = iset._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != p_Var1; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,p_Var6[1]._M_color);
    std::operator<<(poVar5," ");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  skiplist<int,_std::less<int>_>::skiplist(&iskip);
  std::operator<<((ostream *)&std::cout,"Inserting into the skip list:\n");
  uVar7 = 0;
  iVar8 = 10;
  while (bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
    value = uVar7 - 5;
    if (uVar7 < 5) {
      value = uVar7;
    }
    skiplist<int,_std::less<int>_>::insert(&iskip,value);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,value);
    std::operator<<(poVar5," ");
    uVar7 = uVar7 + 1;
  }
  std::operator<<((ostream *)&std::cout,"\n");
  skiplist<int,_std::less<int>_>::erase(&iskip,0);
  skiplist<int,_std::less<int>_>::erase(&iskip,0);
  skiplist<int,_std::less<int>_>::erase(&iskip,2);
  foundit(&iskip,2);
  foundit(&iskip,7);
  skiplistFromVector.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x40000000a;
  skiplistFromVector.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x600000003;
  skiplistFromVector.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  __l._M_len = 5;
  __l._M_array = (iterator)&skiplistFromVector;
  std::vector<int,_std::allocator<int>_>::vector(&v,__l,(allocator_type *)&slFromInitializer);
  skiplist<int,std::less<int>>::
  skiplist<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((skiplist<int,std::less<int>> *)&skiplistFromVector,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::operator<<((ostream *)&std::cout,"Skiplist constructed from vector:\n");
  skiplist<int,_std::less<int>_>::begin(&local_1e80,&skiplistFromVector);
  uVar10 = 0;
  uVar11 = 0;
  first.node._1_7_ = in_stack_ffffffffffffe111;
  first._0_17_ = ZEXT817(in_stack_ffffffffffffe100);
  auVar2._8_8_ = v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
  auVar2._0_8_ = v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
  auVar2._16_8_ = 0;
  display<skiplist<int,std::less<int>>::cake_iterator<false>>
            (first,(cake_iterator<false>)(auVar2 << 0x40));
  local_1e68[0] = 1.1;
  local_1e68[1] = 0.5;
  local_1e68[2] = 100.3;
  l._M_len = 3;
  l._M_array = local_1e68;
  skiplist<double,_std::less<double>_>::skiplist(&slFromInitializer,l);
  std::operator<<((ostream *)&std::cout,"Skiplist constructed using initialzer_list:\n");
  skiplist<double,_std::less<double>_>::begin(&local_1e98,&slFromInitializer);
  auVar4[8] = uVar11;
  auVar4._0_8_ = uVar10;
  auVar4._9_7_ = in_stack_ffffffffffffe111;
  auVar4._16_8_ = 0;
  auVar3._8_8_ = v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
  auVar3._0_8_ = v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
  auVar3._16_8_ = 0;
  display<skiplist<double,std::less<double>>::cake_iterator<false>>
            ((cake_iterator<false>)(auVar4 << 0x40),(cake_iterator<false>)(auVar3 << 0x40));
  std::operator<<((ostream *)&std::cout,"No runtime exceptions. YAY!\n");
  skiplist<double,_std::less<double>_>::~skiplist(&slFromInitializer);
  skiplist<int,_std::less<int>_>::~skiplist(&skiplistFromVector);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  skiplist<int,_std::less<int>_>::~skiplist(&iskip);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&iset._M_t);
  return 0;
}

Assistant:

int main() {
    // set operations
    std::multiset<int> iset;
    for(int i=0; i<10; i++)
        iset.insert(i%5);
    iset.erase(0);
    iset.erase(0);
    iset.erase(1);
    std::multiset<int>::iterator it = iset.find(2);
    it = iset.find(7);

    cout << "The mulitset has:\n";
    for(auto e: iset) {
        cout << e << " ";
    }
    cout << "\n";

    // skip list operations, must mirror the multiset operations
    skiplist<int> iskip;

    cout << "Inserting into the skip list:\n";
    for(int i=0; i<10; i++)
    {
        iskip.insert(i%5);
        cout << i%5 << " ";
    }
    cout << "\n";

    iskip.erase(0);
    iskip.erase(0);
    iskip.erase(2);

    foundit(iskip, 2);
    foundit(iskip, 7);

	std::vector<int> v = {10, 4, 3, 6, 1};
	skiplist<int> skiplistFromVector(begin(v), end(v));
	cout << "Skiplist constructed from vector:\n";
	display(begin(skiplistFromVector), end(skiplistFromVector));

	skiplist<double> slFromInitializer = {1.1, 0.5, 100.3};
	cout << "Skiplist constructed using initialzer_list:\n";
	display(begin(slFromInitializer), end(slFromInitializer));
    cout << "No runtime exceptions. YAY!\n";
}